

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O0

int userauth_password(LIBSSH2_SESSION *session,char *username,uint username_len,uchar *password,
                     uint password_len,
                     _func_void_LIBSSH2_SESSION_ptr_char_ptr_ptr_int_ptr_void_ptr_ptr
                     *passwd_change_cb)

{
  int iVar1;
  uchar *puVar2;
  uchar *puStack_48;
  int rc;
  uchar *s;
  _func_void_LIBSSH2_SESSION_ptr_char_ptr_ptr_int_ptr_void_ptr_ptr *passwd_change_cb_local;
  uchar *puStack_30;
  uint password_len_local;
  uchar *password_local;
  char *pcStack_20;
  uint username_len_local;
  char *username_local;
  LIBSSH2_SESSION *session_local;
  
  s = (uchar *)passwd_change_cb;
  passwd_change_cb_local._4_4_ = password_len;
  puStack_30 = password;
  password_local._4_4_ = username_len;
  pcStack_20 = username;
  username_local = (char *)session;
  if (session->userauth_pswd_state == libssh2_NB_state_idle) {
    memset(&session->userauth_pswd_packet_requirev_state,0,8);
    *(ulong *)(username_local + 0x119b8) = (ulong)(password_local._4_4_ + 0x28);
    username_local[0x119b0] = -0x3d;
    puVar2 = (uchar *)(**(code **)(username_local + 8))
                                (*(undefined8 *)(username_local + 0x119b8),username_local);
    *(uchar **)(username_local + 0x119a8) = puVar2;
    if (*(long *)(username_local + 0x119a8) == 0) {
      puStack_48 = puVar2;
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)username_local,-6,
                             "Unable to allocate memory for userauth-password request");
      return iVar1;
    }
    puStack_48 = puVar2 + 1;
    *puVar2 = '2';
    _libssh2_store_str(&stack0xffffffffffffffb8,pcStack_20,(ulong)password_local._4_4_);
    _libssh2_store_str(&stack0xffffffffffffffb8,"ssh-connection",0xe);
    _libssh2_store_str(&stack0xffffffffffffffb8,"password",8);
    *puStack_48 = '\0';
    puStack_48 = puStack_48 + 1;
    _libssh2_store_u32(&stack0xffffffffffffffb8,passwd_change_cb_local._4_4_);
    username_local[0x119a0] = '\x02';
    username_local[0x119a1] = '\0';
    username_local[0x119a2] = '\0';
    username_local[0x119a3] = '\0';
  }
  if (*(int *)(username_local + 0x119a0) == 2) {
    iVar1 = _libssh2_transport_send
                      ((LIBSSH2_SESSION *)username_local,*(uchar **)(username_local + 0x119a8),
                       *(size_t *)(username_local + 0x119b8),puStack_30,
                       (ulong)passwd_change_cb_local._4_4_);
    if (iVar1 == -0x25) {
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)username_local,-0x25,
                             "Would block writing password request");
      return iVar1;
    }
    (**(code **)(username_local + 0x18))(*(undefined8 *)(username_local + 0x119a8),username_local);
    username_local[0x119a8] = '\0';
    username_local[0x119a9] = '\0';
    username_local[0x119aa] = '\0';
    username_local[0x119ab] = '\0';
    username_local[0x119ac] = '\0';
    username_local[0x119ad] = '\0';
    username_local[0x119ae] = '\0';
    username_local[0x119af] = '\0';
    if (iVar1 != 0) {
      username_local[0x119a0] = '\0';
      username_local[0x119a1] = '\0';
      username_local[0x119a2] = '\0';
      username_local[0x119a3] = '\0';
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)username_local,-7,
                             "Unable to send userauth-password request");
      return iVar1;
    }
    username_local[0x119a0] = '\x03';
    username_local[0x119a1] = '\0';
    username_local[0x119a2] = '\0';
    username_local[0x119a3] = '\0';
  }
  while (((*(int *)(username_local + 0x119a0) == 3 || (*(int *)(username_local + 0x119a0) == 4)) ||
         (*(int *)(username_local + 0x119a0) == 5))) {
    if (*(int *)(username_local + 0x119a0) == 3) {
      iVar1 = _libssh2_packet_requirev
                        ((LIBSSH2_SESSION *)username_local,"43<",
                         (uchar **)(username_local + 0x119a8),(size_t *)(username_local + 0x119b8),0
                         ,(uchar *)0x0,0,(packet_requirev_state_t *)(username_local + 0x119d0));
      if (iVar1 != 0) {
        if (iVar1 != -0x25) {
          username_local[0x119a0] = '\0';
          username_local[0x119a1] = '\0';
          username_local[0x119a2] = '\0';
          username_local[0x119a3] = '\0';
        }
        iVar1 = _libssh2_error((LIBSSH2_SESSION *)username_local,iVar1,
                               "Waiting for password response");
        return iVar1;
      }
      if (*(long *)(username_local + 0x119b8) == 0) {
        username_local[0x119a0] = '\0';
        username_local[0x119a1] = '\0';
        username_local[0x119a2] = '\0';
        username_local[0x119a3] = '\0';
        iVar1 = _libssh2_error((LIBSSH2_SESSION *)username_local,-0xe,"Unexpected packet size");
        return iVar1;
      }
      if (**(char **)(username_local + 0x119a8) == '4') {
        (**(code **)(username_local + 0x18))
                  (*(undefined8 *)(username_local + 0x119a8),username_local);
        username_local[0x119a8] = '\0';
        username_local[0x119a9] = '\0';
        username_local[0x119aa] = '\0';
        username_local[0x119ab] = '\0';
        username_local[0x119ac] = '\0';
        username_local[0x119ad] = '\0';
        username_local[0x119ae] = '\0';
        username_local[0x119af] = '\0';
        *(uint *)(username_local + 0x80) = *(uint *)(username_local + 0x80) | 8;
        username_local[0x119a0] = '\0';
        username_local[0x119a1] = '\0';
        username_local[0x119a2] = '\0';
        username_local[0x119a3] = '\0';
        return 0;
      }
      if (**(char **)(username_local + 0x119a8) == '3') {
        (**(code **)(username_local + 0x18))
                  (*(undefined8 *)(username_local + 0x119a8),username_local);
        username_local[0x119a8] = '\0';
        username_local[0x119a9] = '\0';
        username_local[0x119aa] = '\0';
        username_local[0x119ab] = '\0';
        username_local[0x119ac] = '\0';
        username_local[0x119ad] = '\0';
        username_local[0x119ae] = '\0';
        username_local[0x119af] = '\0';
        username_local[0x119a0] = '\0';
        username_local[0x119a1] = '\0';
        username_local[0x119a2] = '\0';
        username_local[0x119a3] = '\0';
        iVar1 = _libssh2_error((LIBSSH2_SESSION *)username_local,-0x12,
                               "Authentication failed (username/password)");
        return iVar1;
      }
      username_local[0x119c0] = '\0';
      username_local[0x119c1] = '\0';
      username_local[0x119c2] = '\0';
      username_local[0x119c3] = '\0';
      username_local[0x119c4] = '\0';
      username_local[0x119c5] = '\0';
      username_local[0x119c6] = '\0';
      username_local[0x119c7] = '\0';
      username_local[0x119c8] = '\0';
      username_local[0x119c9] = '\0';
      username_local[0x119ca] = '\0';
      username_local[0x119cb] = '\0';
      username_local[0x119a0] = '\x04';
      username_local[0x119a1] = '\0';
      username_local[0x119a2] = '\0';
      username_local[0x119a3] = '\0';
    }
    if (*(long *)(username_local + 0x119b8) == 0) {
      username_local[0x119a0] = '\0';
      username_local[0x119a1] = '\0';
      username_local[0x119a2] = '\0';
      username_local[0x119a3] = '\0';
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)username_local,-0xe,"Unexpected packet size");
      return iVar1;
    }
    if ((**(char **)(username_local + 0x119a8) != '<') && (username_local[0x119b0] != '<')) break;
    username_local[0x119b0] = '<';
    if ((*(int *)(username_local + 0x119a0) != 4) && (*(int *)(username_local + 0x119a0) != 5)) {
      username_local[0x119a0] = '\0';
      username_local[0x119a1] = '\0';
      username_local[0x119a2] = '\0';
      username_local[0x119a3] = '\0';
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)username_local,-0xf,
                             "Password Expired, and no callback specified");
      return iVar1;
    }
    if (*(int *)(username_local + 0x119a0) == 4) {
      (**(code **)(username_local + 0x18))(*(undefined8 *)(username_local + 0x119a8),username_local)
      ;
      username_local[0x119a8] = '\0';
      username_local[0x119a9] = '\0';
      username_local[0x119aa] = '\0';
      username_local[0x119ab] = '\0';
      username_local[0x119ac] = '\0';
      username_local[0x119ad] = '\0';
      username_local[0x119ae] = '\0';
      username_local[0x119af] = '\0';
    }
    if (s == (uchar *)0x0) break;
    if (*(int *)(username_local + 0x119a0) == 4) {
      (*(code *)s)(username_local,username_local + 0x119c0,username_local + 0x119c8,username_local);
      if (*(long *)(username_local + 0x119c0) == 0) {
        iVar1 = _libssh2_error((LIBSSH2_SESSION *)username_local,-0xf,
                               "Password expired, and callback failed");
        return iVar1;
      }
      *(ulong *)(username_local + 0x119b8) =
           (ulong)(password_local._4_4_ + passwd_change_cb_local._4_4_ + 0x2c);
      puVar2 = (uchar *)(**(code **)(username_local + 8))
                                  (*(undefined8 *)(username_local + 0x119b8),username_local);
      *(uchar **)(username_local + 0x119a8) = puVar2;
      if (*(long *)(username_local + 0x119a8) == 0) {
        puStack_48 = puVar2;
        (**(code **)(username_local + 0x18))
                  (*(undefined8 *)(username_local + 0x119c0),username_local);
        username_local[0x119c0] = '\0';
        username_local[0x119c1] = '\0';
        username_local[0x119c2] = '\0';
        username_local[0x119c3] = '\0';
        username_local[0x119c4] = '\0';
        username_local[0x119c5] = '\0';
        username_local[0x119c6] = '\0';
        username_local[0x119c7] = '\0';
        iVar1 = _libssh2_error((LIBSSH2_SESSION *)username_local,-6,
                               "Unable to allocate memory for userauth password change request");
        return iVar1;
      }
      puStack_48 = puVar2 + 1;
      *puVar2 = '2';
      _libssh2_store_str(&stack0xffffffffffffffb8,pcStack_20,(ulong)password_local._4_4_);
      _libssh2_store_str(&stack0xffffffffffffffb8,"ssh-connection",0xe);
      _libssh2_store_str(&stack0xffffffffffffffb8,"password",8);
      *puStack_48 = '\x01';
      puStack_48 = puStack_48 + 1;
      _libssh2_store_str(&stack0xffffffffffffffb8,(char *)puStack_30,
                         (ulong)passwd_change_cb_local._4_4_);
      _libssh2_store_u32(&stack0xffffffffffffffb8,*(uint32_t *)(username_local + 0x119c8));
      username_local[0x119a0] = '\x05';
      username_local[0x119a1] = '\0';
      username_local[0x119a2] = '\0';
      username_local[0x119a3] = '\0';
    }
    if (*(int *)(username_local + 0x119a0) != 5) break;
    iVar1 = _libssh2_transport_send
                      ((LIBSSH2_SESSION *)username_local,*(uchar **)(username_local + 0x119a8),
                       *(size_t *)(username_local + 0x119b8),*(uchar **)(username_local + 0x119c0),
                       (long)*(int *)(username_local + 0x119c8));
    if (iVar1 == -0x25) {
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)username_local,-0x25,"Would block waiting");
      return iVar1;
    }
    (**(code **)(username_local + 0x18))(*(undefined8 *)(username_local + 0x119a8),username_local);
    username_local[0x119a8] = '\0';
    username_local[0x119a9] = '\0';
    username_local[0x119aa] = '\0';
    username_local[0x119ab] = '\0';
    username_local[0x119ac] = '\0';
    username_local[0x119ad] = '\0';
    username_local[0x119ae] = '\0';
    username_local[0x119af] = '\0';
    (**(code **)(username_local + 0x18))(*(undefined8 *)(username_local + 0x119c0),username_local);
    username_local[0x119c0] = '\0';
    username_local[0x119c1] = '\0';
    username_local[0x119c2] = '\0';
    username_local[0x119c3] = '\0';
    username_local[0x119c4] = '\0';
    username_local[0x119c5] = '\0';
    username_local[0x119c6] = '\0';
    username_local[0x119c7] = '\0';
    if (iVar1 != 0) {
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)username_local,-7,
                             "Unable to send userauth password-change request");
      return iVar1;
    }
    username_local[0x119a0] = '\x03';
    username_local[0x119a1] = '\0';
    username_local[0x119a2] = '\0';
    username_local[0x119a3] = '\0';
  }
  (**(code **)(username_local + 0x18))(*(undefined8 *)(username_local + 0x119a8),username_local);
  username_local[0x119a8] = '\0';
  username_local[0x119a9] = '\0';
  username_local[0x119aa] = '\0';
  username_local[0x119ab] = '\0';
  username_local[0x119ac] = '\0';
  username_local[0x119ad] = '\0';
  username_local[0x119ae] = '\0';
  username_local[0x119af] = '\0';
  username_local[0x119a0] = '\0';
  username_local[0x119a1] = '\0';
  username_local[0x119a2] = '\0';
  username_local[0x119a3] = '\0';
  iVar1 = _libssh2_error((LIBSSH2_SESSION *)username_local,-0x12,"Authentication failed");
  return iVar1;
}

Assistant:

static int
userauth_password(LIBSSH2_SESSION *session,
                  const char *username, unsigned int username_len,
                  const unsigned char *password, unsigned int password_len,
                  LIBSSH2_PASSWD_CHANGEREQ_FUNC((*passwd_change_cb)))
{
    unsigned char *s;
    static const unsigned char reply_codes[4] =
        { SSH_MSG_USERAUTH_SUCCESS, SSH_MSG_USERAUTH_FAILURE,
          SSH_MSG_USERAUTH_PASSWD_CHANGEREQ, 0
        };
    int rc;

    if(session->userauth_pswd_state == libssh2_NB_state_idle) {
        /* Zero the whole thing out */
        memset(&session->userauth_pswd_packet_requirev_state, 0,
               sizeof(session->userauth_pswd_packet_requirev_state));

        /*
         * 40 = packet_type(1) + username_len(4) + service_len(4) +
         * service(14)"ssh-connection" + method_len(4) + method(8)"password" +
         * chgpwdbool(1) + password_len(4) */
        session->userauth_pswd_data_len = username_len + 40;

        session->userauth_pswd_data0 =
            (unsigned char) ~SSH_MSG_USERAUTH_PASSWD_CHANGEREQ;

        /* TODO: remove this alloc with a fixed buffer in the session
           struct */
        s = session->userauth_pswd_data =
            LIBSSH2_ALLOC(session, session->userauth_pswd_data_len);
        if(!session->userauth_pswd_data) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for "
                                  "userauth-password request");
        }

        *(s++) = SSH_MSG_USERAUTH_REQUEST;
        _libssh2_store_str(&s, username, username_len);
        _libssh2_store_str(&s, "ssh-connection", sizeof("ssh-connection") - 1);
        _libssh2_store_str(&s, "password", sizeof("password") - 1);
        *s++ = '\0';
        _libssh2_store_u32(&s, password_len);
        /* 'password' is sent separately */

        _libssh2_debug((session, LIBSSH2_TRACE_AUTH,
                       "Attempting to login using password authentication"));

        session->userauth_pswd_state = libssh2_NB_state_created;
    }

    if(session->userauth_pswd_state == libssh2_NB_state_created) {
        rc = _libssh2_transport_send(session, session->userauth_pswd_data,
                                     session->userauth_pswd_data_len,
                                     password, password_len);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                                  "Would block writing password request");
        }

        /* now free the sent packet */
        LIBSSH2_FREE(session, session->userauth_pswd_data);
        session->userauth_pswd_data = NULL;

        if(rc) {
            session->userauth_pswd_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "Unable to send userauth-password request");
        }

        session->userauth_pswd_state = libssh2_NB_state_sent;
    }

password_response:

    if((session->userauth_pswd_state == libssh2_NB_state_sent)
        || (session->userauth_pswd_state == libssh2_NB_state_sent1)
        || (session->userauth_pswd_state == libssh2_NB_state_sent2)) {
        if(session->userauth_pswd_state == libssh2_NB_state_sent) {
            rc = _libssh2_packet_requirev(session, reply_codes,
                                          &session->userauth_pswd_data,
                                          &session->userauth_pswd_data_len,
                                          0, NULL, 0,
                                          &session->
                                          userauth_pswd_packet_requirev_state);

            if(rc) {
                if(rc != LIBSSH2_ERROR_EAGAIN)
                    session->userauth_pswd_state = libssh2_NB_state_idle;

                return _libssh2_error(session, rc,
                                      "Waiting for password response");
            }
            else if(session->userauth_pswd_data_len < 1) {
                session->userauth_pswd_state = libssh2_NB_state_idle;
                return _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                      "Unexpected packet size");
            }

            if(session->userauth_pswd_data[0] == SSH_MSG_USERAUTH_SUCCESS) {
                _libssh2_debug((session, LIBSSH2_TRACE_AUTH,
                               "Password authentication successful"));
                LIBSSH2_FREE(session, session->userauth_pswd_data);
                session->userauth_pswd_data = NULL;
                session->state |= LIBSSH2_STATE_AUTHENTICATED;
                session->userauth_pswd_state = libssh2_NB_state_idle;
                return 0;
            }
            else if(session->userauth_pswd_data[0] ==
                    SSH_MSG_USERAUTH_FAILURE) {
                _libssh2_debug((session, LIBSSH2_TRACE_AUTH,
                               "Password authentication failed"));
                LIBSSH2_FREE(session, session->userauth_pswd_data);
                session->userauth_pswd_data = NULL;
                session->userauth_pswd_state = libssh2_NB_state_idle;
                return _libssh2_error(session,
                                      LIBSSH2_ERROR_AUTHENTICATION_FAILED,
                                      "Authentication failed "
                                      "(username/password)");
            }

            session->userauth_pswd_newpw = NULL;
            session->userauth_pswd_newpw_len = 0;

            session->userauth_pswd_state = libssh2_NB_state_sent1;
        }

        if(session->userauth_pswd_data_len < 1) {
            session->userauth_pswd_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                  "Unexpected packet size");
        }

        if((session->userauth_pswd_data[0] ==
             SSH_MSG_USERAUTH_PASSWD_CHANGEREQ)
            || (session->userauth_pswd_data0 ==
                SSH_MSG_USERAUTH_PASSWD_CHANGEREQ)) {
            session->userauth_pswd_data0 = SSH_MSG_USERAUTH_PASSWD_CHANGEREQ;

            if((session->userauth_pswd_state == libssh2_NB_state_sent1) ||
                (session->userauth_pswd_state == libssh2_NB_state_sent2)) {
                if(session->userauth_pswd_state == libssh2_NB_state_sent1) {
                    _libssh2_debug((session, LIBSSH2_TRACE_AUTH,
                                   "Password change required"));
                    LIBSSH2_FREE(session, session->userauth_pswd_data);
                    session->userauth_pswd_data = NULL;
                }
                if(passwd_change_cb) {
                    if(session->userauth_pswd_state ==
                       libssh2_NB_state_sent1) {
                        passwd_change_cb(session,
                                         &session->userauth_pswd_newpw,
                                         &session->userauth_pswd_newpw_len,
                                         &session->abstract);
                        if(!session->userauth_pswd_newpw) {
                            return _libssh2_error(session,
                                                LIBSSH2_ERROR_PASSWORD_EXPIRED,
                                                  "Password expired, and "
                                                  "callback failed");
                        }

                        /* basic data_len + newpw_len(4) */
                        if(username_len + password_len + 44 <= UINT_MAX) {
                            session->userauth_pswd_data_len =
                                username_len + password_len + 44;
                            s = session->userauth_pswd_data =
                                LIBSSH2_ALLOC(session,
                                              session->userauth_pswd_data_len);
                        }
                        else {
                            s = session->userauth_pswd_data = NULL;
                            session->userauth_pswd_data_len = 0;
                        }

                        if(!session->userauth_pswd_data) {
                            LIBSSH2_FREE(session,
                                         session->userauth_pswd_newpw);
                            session->userauth_pswd_newpw = NULL;
                            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                                  "Unable to allocate memory "
                                                  "for userauth password "
                                                  "change request");
                        }

                        *(s++) = SSH_MSG_USERAUTH_REQUEST;
                        _libssh2_store_str(&s, username, username_len);
                        _libssh2_store_str(&s, "ssh-connection",
                                           sizeof("ssh-connection") - 1);
                        _libssh2_store_str(&s, "password",
                                           sizeof("password") - 1);
                        *s++ = 0x01;
                        _libssh2_store_str(&s, (char *)password, password_len);
                        _libssh2_store_u32(&s,
                                           session->userauth_pswd_newpw_len);
                        /* send session->userauth_pswd_newpw separately */

                        session->userauth_pswd_state = libssh2_NB_state_sent2;
                    }

                    if(session->userauth_pswd_state ==
                       libssh2_NB_state_sent2) {
                        rc = _libssh2_transport_send(session,
                                            session->userauth_pswd_data,
                                            session->userauth_pswd_data_len,
                                            (unsigned char *)
                                            session->userauth_pswd_newpw,
                                            session->userauth_pswd_newpw_len);
                        if(rc == LIBSSH2_ERROR_EAGAIN) {
                            return _libssh2_error(session,
                                                  LIBSSH2_ERROR_EAGAIN,
                                                  "Would block waiting");
                        }

                        /* free the allocated packets again */
                        LIBSSH2_FREE(session, session->userauth_pswd_data);
                        session->userauth_pswd_data = NULL;
                        LIBSSH2_FREE(session, session->userauth_pswd_newpw);
                        session->userauth_pswd_newpw = NULL;

                        if(rc) {
                            return _libssh2_error(session,
                                                  LIBSSH2_ERROR_SOCKET_SEND,
                                                  "Unable to send userauth "
                                                  "password-change request");
                        }

                        /*
                         * Ugliest use of goto ever.  Blame it on the
                         * askN => requirev migration.
                         */
                        session->userauth_pswd_state = libssh2_NB_state_sent;
                        goto password_response;
                    }
                }
            }
            else {
                session->userauth_pswd_state = libssh2_NB_state_idle;
                return _libssh2_error(session, LIBSSH2_ERROR_PASSWORD_EXPIRED,
                                      "Password Expired, and no callback "
                                      "specified");
            }
        }
    }

    /* FAILURE */
    LIBSSH2_FREE(session, session->userauth_pswd_data);
    session->userauth_pswd_data = NULL;
    session->userauth_pswd_state = libssh2_NB_state_idle;

    return _libssh2_error(session, LIBSSH2_ERROR_AUTHENTICATION_FAILED,
                          "Authentication failed");
}